

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::Message,google::protobuf::UnknownFieldSet>
          (ExtensionSet *this,char *ptr,Message *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  byte bVar1;
  DescriptorPool *pDVar2;
  MessageFactory *pMVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ushort *p;
  bool bVar6;
  ushort *p_00;
  MessageLite *this_00;
  string *psVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  uint32_t res;
  ushort *unaff_RBP;
  uint uVar11;
  UnknownFieldSet *this_01;
  byte bVar12;
  int field_number;
  ulong uVar13;
  ulong unaff_R14;
  ulong uVar14;
  string_view flat;
  Metadata MVar15;
  pair<const_char_*,_int> pVar16;
  pair<const_char_*,_unsigned_int> pVar17;
  bool was_packed_on_wire;
  string payload;
  GeneratedExtensionFinder finder;
  ExtensionInfo extension;
  bool local_121;
  ushort *local_120;
  ExtensionSet *local_118;
  InternalMetadata *local_110;
  DescriptorPool *local_108;
  Data *local_100;
  char *local_f8;
  size_t local_f0;
  char local_e8;
  undefined7 uStack_e7;
  undefined1 local_d8 [16];
  undefined1 local_c8 [112];
  _Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false> local_58;
  undefined8 uStack_50;
  FieldDescriptor *local_48;
  undefined8 uStack_40;
  
  local_f8 = &local_e8;
  local_f0 = 0;
  local_e8 = '\0';
  local_100 = &ctx->data_;
  bVar12 = 0;
  uVar14 = 0;
  local_120 = (ushort *)ptr;
  local_118 = this;
  local_110 = metadata;
  local_108 = (DescriptorPool *)extendee;
  do {
    bVar6 = EpsCopyInputStream::DoneWithCheck<false>
                      (&ctx->super_EpsCopyInputStream,(char **)&local_120,ctx->group_depth_);
    p = local_120;
    p_00 = local_120;
    if (bVar6) break;
    p_00 = (ushort *)((long)local_120 + 1);
    if ((byte)*local_120 == 0x1a) {
      if (bVar12 == 1) {
        local_120 = p_00;
        local_120 = (ushort *)
                    ParseField(local_118,uVar14 * 8 + 2,(char *)p_00,(Message *)local_108,local_110,
                               ctx);
        bVar12 = 3;
        p_00 = unaff_RBP;
        if (local_120 == (ushort *)0x0) {
          bVar12 = 1;
LAB_004a5e40:
          bVar6 = false;
          p_00 = (ushort *)0x0;
        }
        else {
LAB_004a5fb8:
          bVar6 = true;
        }
      }
      else {
        local_d8._0_8_ = local_c8;
        local_d8._8_8_ = (MessageFactory *)0x0;
        local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
        bVar1 = *(byte *)p_00;
        if ((char)bVar1 < '\0') {
          local_120 = p_00;
          pVar16 = ReadSizeFallback((char *)p_00,(uint)bVar1);
          auVar4 = pVar16._0_12_;
        }
        else {
          auVar4[8] = bVar1;
          auVar4._0_8_ = local_120 + 1;
          auVar4._9_3_ = 0;
        }
        local_120 = auVar4._0_8_;
        if ((local_120 == (ushort *)0x0) ||
           (local_120 = (ushort *)
                        EpsCopyInputStream::ReadString
                                  (&ctx->super_EpsCopyInputStream,(char *)local_120,auVar4._8_4_,
                                   (string *)local_d8), local_120 == (ushort *)0x0)) {
          bVar6 = false;
          p_00 = (ushort *)0x0;
        }
        else {
          bVar6 = true;
          p_00 = unaff_RBP;
          if (bVar12 == 0) {
            std::__cxx11::string::operator=((string *)&local_f8,(string *)local_d8);
            bVar12 = 2;
          }
        }
        if ((DescriptorPool *)local_d8._0_8_ != (DescriptorPool *)local_c8) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
        }
        if (bVar6) goto LAB_004a5fb8;
        bVar6 = false;
      }
    }
    else {
      if ((byte)*local_120 != 0x10) {
        bVar1 = (byte)*local_120;
        uVar10 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          res = ((uint)bVar1 + (uint)*(byte *)p_00 * 0x80) - 0x80;
          if ((char)*(byte *)p_00 < '\0') {
            local_120 = p_00;
            pVar17 = ReadTagFallback((char *)p,res);
            auVar5 = pVar17._0_12_;
          }
          else {
            auVar5._8_4_ = res;
            auVar5._0_8_ = local_120 + 1;
          }
          uVar10 = auVar5._8_4_;
          p_00 = auVar5._0_8_;
        }
        local_120 = p_00;
        if (uVar10 != 0 && (uVar10 & 7) != 4) {
          local_120 = (ushort *)
                      ParseField(local_118,(ulong)uVar10,(char *)p_00,(Message *)local_108,local_110
                                 ,ctx);
          p_00 = unaff_RBP;
          if (local_120 == (ushort *)0x0) goto LAB_004a5e40;
          goto LAB_004a5fb8;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
        bVar6 = false;
        goto LAB_004a5fc1;
      }
      uVar11 = (uint)(char)*p_00;
      uVar10 = (*p_00 & uVar11) + uVar11;
      uVar13 = (ulong)(uVar10 >> 1);
      if ((short)uVar10 < 0) {
        local_120 = (ushort *)((long)local_120 + 3);
        lVar9 = 0xd;
        do {
          uVar11 = (uint)(char)*local_120;
          uVar10 = (*local_120 & uVar11) + uVar11;
          uVar13 = ((ulong)uVar10 - 2 << ((byte)lVar9 & 0x3f)) + uVar13;
          if (-1 < (short)uVar10) {
            local_120 = (ushort *)((long)local_120 + (ulong)(uVar10 < uVar11) + 1);
            goto LAB_004a5c14;
          }
          lVar9 = lVar9 + 0xe;
          local_120 = local_120 + 1;
        } while (lVar9 != 0x45);
        local_120 = (ushort *)0x0;
        uVar13 = unaff_R14;
      }
      else {
        local_120 = (ushort *)((long)local_120 + (ulong)(uVar10 < uVar11) + 2);
      }
LAB_004a5c14:
      bVar6 = false;
      if ((local_120 == (ushort *)0x0) || (field_number = (int)uVar13, field_number == 0)) {
        unaff_RBP = (ushort *)0x0;
      }
      else {
        bVar6 = true;
        if (bVar12 == 0) {
          bVar12 = 1;
        }
        else {
          if (bVar12 != 2) goto LAB_004a5fb1;
          local_48 = (FieldDescriptor *)0x0;
          uStack_40 = 0;
          local_58._M_head_impl = (FeatureSetDefaults *)0x0;
          uStack_50 = 0;
          local_c8._96_8_ = (ctrl_t *)0x0;
          local_c8._104_8_ = (MaybeInitializedPtr)0x0;
          pDVar2 = local_100->pool;
          if (pDVar2 == (DescriptorPool *)0x0) {
            local_d8._0_8_ = local_108;
            bVar6 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                              (local_118,2,field_number,(GeneratedExtensionFinder *)local_d8,
                               (ExtensionInfo *)(local_c8 + 0x60),&local_121);
          }
          else {
            pMVar3 = (ctx->data_).factory;
            MVar15 = Message::GetMetadata((Message *)local_108);
            local_c8._0_8_ = MVar15.descriptor;
            local_d8._0_8_ = pDVar2;
            local_d8._8_8_ = pMVar3;
            bVar6 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::DescriptorPoolExtensionFinder>
                              (local_118,2,field_number,(DescriptorPoolExtensionFinder *)local_d8,
                               (ExtensionInfo *)(local_c8 + 0x60),&local_121);
          }
          pcVar8 = local_f8;
          if (bVar6 == false) {
            if ((local_110->ptr_ & 1U) == 0) {
              this_01 = InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_110);
            }
            else {
              this_01 = (UnknownFieldSet *)((local_110->ptr_ & 0xfffffffffffffffeU) + 8);
            }
            psVar7 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_01,field_number);
            std::__cxx11::string::_M_replace
                      ((ulong)psVar7,0,(char *)psVar7->_M_string_length,(ulong)pcVar8);
            bVar12 = 3;
            bVar6 = true;
          }
          else {
            if (local_c8[0x6d] == '\0') {
              this_00 = MutableMessage(local_118,field_number,'\v',
                                       (MessageLite *)local_58._M_head_impl,local_48);
            }
            else {
              this_00 = AddMessage(local_118,field_number,'\v',(MessageLite *)local_58._M_head_impl,
                                   local_48);
            }
            local_c8._48_8_ =
                 (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0;
            local_c8._56_8_ = (Tables *)0x0;
            local_c8._32_8_ = (ErrorCollector *)0x0;
            local_c8._40_8_ = (DescriptorPool *)0x0;
            local_c8._16_8_ = (ZeroCopyInputStream *)0x0;
            local_c8._24_8_ = (DescriptorDatabase *)0x0;
            local_c8._64_4_ = 0;
            local_c8._68_4_ = 0x7fffffff;
            local_c8._72_4_ = ctx->depth_;
            local_c8._76_4_ = -0x80000000;
            local_c8._80_8_ = local_100->pool;
            local_c8._88_8_ = local_100->factory;
            flat._M_str = local_f8;
            flat._M_len = local_f0;
            pcVar8 = EpsCopyInputStream::InitFrom((EpsCopyInputStream *)local_d8,flat);
            pcVar8 = MessageLite::_InternalParse(this_00,pcVar8,(ParseContext *)local_d8);
            bVar6 = local_c8._64_4_ == 0 && pcVar8 != (char *)0x0;
            if (local_c8._64_4_ != 0 || pcVar8 == (char *)0x0) {
              unaff_RBP = (ushort *)0x0;
            }
            bVar12 = bVar6 | 2;
          }
        }
        uVar14 = uVar13 & 0xffffffff;
      }
LAB_004a5fb1:
      p_00 = unaff_RBP;
      unaff_R14 = uVar13;
      if (bVar6) goto LAB_004a5fb8;
      bVar6 = false;
    }
LAB_004a5fc1:
    unaff_RBP = p_00;
  } while (bVar6);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  return (char *)p_00;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  enum class State { kNoTag, kHasType, kHasPayload, kDone };
  State state = State::kNoTag;

  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      // We should fail parsing if type id is 0 after cast to uint32.
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                     static_cast<uint32_t>(tmp) != 0);
      if (state == State::kNoTag) {
        type_id = static_cast<uint32_t>(tmp);
        state = State::kHasType;
      } else if (state == State::kHasPayload) {
        type_id = static_cast<uint32_t>(tmp);
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools. Spawn a new
          // ParseContext inheriting those attributes.
          ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        state = State::kDone;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (state == State::kHasType) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        state = State::kDone;
      } else {
        std::string tmp;
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        if (state == State::kNoTag) {
          payload = std::move(tmp);
          state = State::kHasPayload;
        }
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}